

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.cpp
# Opt level: O0

void mapVoronoiZoom(Layer *l,int *out,longlong areaX,longlong areaZ,int areaWidth,int areaHeight)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  void *__ptr;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dd;
  double dc;
  double db;
  double da;
  int idx;
  int v11;
  int v10;
  double dd2;
  double dd1;
  double dc2;
  double dc1;
  double db2;
  double db1;
  double da2;
  double da1;
  int v01;
  int v00;
  int *buf;
  int j;
  int i;
  int z;
  int x;
  int newHeight;
  int newWidth;
  int pHeight;
  int pWidth;
  int pZ;
  int pX;
  int areaHeight_local;
  int areaWidth_local;
  longlong areaZ_local;
  longlong areaX_local;
  int *out_local;
  Layer *l_local;
  
  iVar3 = (int)(areaX - 2U) >> 2;
  iVar4 = (int)(areaZ - 2U) >> 2;
  iVar5 = areaWidth >> 2;
  iVar6 = iVar5 + 2;
  iVar7 = areaHeight >> 2;
  iVar8 = (iVar5 + 1) * 4;
  __ptr = malloc((long)((iVar8 + 1) * ((iVar7 + 1) * 4 + 1)) << 2);
  (*l->p->getMap)(l->p,out,(long)iVar3,(long)iVar4,iVar6,iVar7 + 2);
  for (j = 0; j < iVar7 + 1; j = j + 1) {
    da1._0_4_ = out[(j + 1) * iVar6];
    da1._4_4_ = out[j * iVar6];
    for (i = 0; i < iVar5 + 1; i = i + 1) {
      setChunkSeed(l,(long)((i + iVar3) * 4),(long)((j + iVar4) * 4));
      iVar9 = mcNextInt(l,0x400);
      dVar10 = ((double)iVar9 / 1024.0 - 0.5) * 3.6;
      iVar9 = mcNextInt(l,0x400);
      dVar11 = ((double)iVar9 / 1024.0 - 0.5) * 3.6;
      setChunkSeed(l,(long)((i + iVar3 + 1) * 4),(long)((j + iVar4) * 4));
      iVar9 = mcNextInt(l,0x400);
      dVar12 = ((double)iVar9 / 1024.0 - 0.5) * 3.6 + 4.0;
      iVar9 = mcNextInt(l,0x400);
      dVar13 = ((double)iVar9 / 1024.0 - 0.5) * 3.6;
      setChunkSeed(l,(long)((i + iVar3) * 4),(long)((j + iVar4 + 1) * 4));
      iVar9 = mcNextInt(l,0x400);
      dVar14 = ((double)iVar9 / 1024.0 - 0.5) * 3.6;
      iVar9 = mcNextInt(l,0x400);
      dVar15 = ((double)iVar9 / 1024.0 - 0.5) * 3.6 + 4.0;
      setChunkSeed(l,(long)((i + iVar3 + 1) * 4),(long)((j + iVar4 + 1) * 4));
      iVar9 = mcNextInt(l,0x400);
      dVar16 = ((double)iVar9 / 1024.0 - 0.5) * 3.6 + 4.0;
      iVar9 = mcNextInt(l,0x400);
      dVar17 = ((double)iVar9 / 1024.0 - 0.5) * 3.6 + 4.0;
      uVar1 = out[i + 1 + j * iVar6];
      uVar2 = out[i + 1 + (j + 1) * iVar6];
      for (buf._0_4_ = 0; (int)buf < 4; buf._0_4_ = (int)buf + 1) {
        da._4_4_ = (j * 4 + (int)buf) * iVar8 + i * 4;
        for (buf._4_4_ = 0; buf._4_4_ < 4; buf._4_4_ = buf._4_4_ + 1) {
          dVar18 = ((double)(int)buf - dVar11) * ((double)(int)buf - dVar11) +
                   ((double)buf._4_4_ - dVar10) * ((double)buf._4_4_ - dVar10);
          dVar19 = ((double)(int)buf - dVar13) * ((double)(int)buf - dVar13) +
                   ((double)buf._4_4_ - dVar12) * ((double)buf._4_4_ - dVar12);
          dVar20 = ((double)(int)buf - dVar15) * ((double)(int)buf - dVar15) +
                   ((double)buf._4_4_ - dVar14) * ((double)buf._4_4_ - dVar14);
          dVar21 = ((double)(int)buf - dVar17) * ((double)(int)buf - dVar17) +
                   ((double)buf._4_4_ - dVar16) * ((double)buf._4_4_ - dVar16);
          if (((dVar19 <= dVar18) || (dVar20 <= dVar18)) || (dVar21 <= dVar18)) {
            if (((dVar18 <= dVar19) || (dVar20 <= dVar19)) || (dVar21 <= dVar19)) {
              if (((dVar18 <= dVar20) || (dVar19 <= dVar20)) || (dVar21 <= dVar20)) {
                *(uint *)((long)__ptr + (long)da._4_4_ * 4) = uVar2 & 0xff;
              }
              else {
                *(uint *)((long)__ptr + (long)da._4_4_ * 4) = da1._0_4_;
              }
            }
            else {
              *(uint *)((long)__ptr + (long)da._4_4_ * 4) = uVar1 & 0xff;
            }
          }
          else {
            *(uint *)((long)__ptr + (long)da._4_4_ * 4) = da1._4_4_;
          }
          da._4_4_ = da._4_4_ + 1;
        }
      }
      da1._0_4_ = uVar2 & 0xff;
      da1._4_4_ = uVar1 & 0xff;
    }
  }
  for (j = 0; j < areaHeight; j = j + 1) {
    memcpy(out + j * areaWidth,
           (void *)((long)__ptr +
                   (((long)j + (areaZ - 2U & 3)) * (long)iVar8 + (areaX - 2U & 3)) * 4),
           (long)areaWidth << 2);
  }
  free(__ptr);
  return;
}

Assistant:

void mapVoronoiZoom(Layer *l, int *__restrict out, long long areaX, long long areaZ, int areaWidth, int areaHeight) {
    areaX -= 2;
    areaZ -= 2;
    int pX = (int) areaX >> 2;
    int pZ = (int) areaZ >> 2;
    int pWidth = (areaWidth >> 2) + 2;
    int pHeight = (areaHeight >> 2) + 2;
    int newWidth = (pWidth - 1) << 2;
    int newHeight = (pHeight - 1) << 2;
    int x, z, i, j;
    int *buf = (int *) malloc((newWidth + 1) * (newHeight + 1) * sizeof(*buf));

    l->p->getMap(l->p, out, pX, pZ, pWidth, pHeight);

    for (z = 0; z < pHeight - 1; z++) {
        int v00 = out[(z + 0) * pWidth];
        int v01 = out[(z + 1) * pWidth];

        for (x = 0; x < pWidth - 1; x++) {
            setChunkSeed(l, (x + pX) << 2, (z + pZ) << 2);
            double da1 = (mcNextInt(l, 1024) / 1024.0 - 0.5) * 3.6;
            double da2 = (mcNextInt(l, 1024) / 1024.0 - 0.5) * 3.6;

            setChunkSeed(l, (x + pX + 1) << 2, (z + pZ) << 2);
            double db1 = (mcNextInt(l, 1024) / 1024.0 - 0.5) * 3.6 + 4.0;
            double db2 = (mcNextInt(l, 1024) / 1024.0 - 0.5) * 3.6;

            setChunkSeed(l, (x + pX) << 2, (z + pZ + 1) << 2);
            double dc1 = (mcNextInt(l, 1024) / 1024.0 - 0.5) * 3.6;
            double dc2 = (mcNextInt(l, 1024) / 1024.0 - 0.5) * 3.6 + 4.0;

            setChunkSeed(l, (x + pX + 1) << 2, (z + pZ + 1) << 2);
            double dd1 = (mcNextInt(l, 1024) / 1024.0 - 0.5) * 3.6 + 4.0;
            double dd2 = (mcNextInt(l, 1024) / 1024.0 - 0.5) * 3.6 + 4.0;

            int v10 = out[x + 1 + (z + 0) * pWidth] & 255;
            int v11 = out[x + 1 + (z + 1) * pWidth] & 255;

            for (j = 0; j < 4; j++) {
                int idx = ((z << 2) + j) * newWidth + (x << 2);

                for (i = 0; i < 4; i++) {
                    double da = (j - da2) * (j - da2) + (i - da1) * (i - da1);
                    double db = (j - db2) * (j - db2) + (i - db1) * (i - db1);
                    double dc = (j - dc2) * (j - dc2) + (i - dc1) * (i - dc1);
                    double dd = (j - dd2) * (j - dd2) + (i - dd1) * (i - dd1);

                    if (da < db && da < dc && da < dd) {
                        buf[idx++] = v00;
                    } else if (db < da && db < dc && db < dd) {
                        buf[idx++] = v10;
                    } else if (dc < da && dc < db && dc < dd) {
                        buf[idx++] = v01;
                    } else {
                        buf[idx++] = v11;
                    }
                }
            }

            v00 = v10;
            v01 = v11;
        }
    }

    for (z = 0; z < areaHeight; z++) {
        memcpy(&out[z * areaWidth], &buf[(z + (areaZ & 3)) * newWidth + (areaX & 3)], areaWidth * sizeof(int));
    }

    free(buf);
}